

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

OpenMPClause *
OpenMPBindClause::addBindClause(OpenMPDirective *directive,OpenMPBindClauseBinding bind_binding)

{
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar1;
  ostream *poVar2;
  mapped_type *ppvVar3;
  key_type local_2c;
  OpenMPClause *local_28;
  
  pvVar1 = OpenMPDirective::getClauses(directive,OMPC_bind);
  if ((pvVar1->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pvVar1->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_28 = (OpenMPClause *)operator_new(0x70);
    (local_28->super_SourceLocation).line = 0;
    (local_28->super_SourceLocation).column = 0;
    (local_28->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    local_28->kind = OMPC_bind;
    local_28->clause_position = -1;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__0019d588;
    *(OpenMPBindClauseBinding *)&local_28[1]._vptr_OpenMPClause = bind_binding;
    pvVar1 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
    (pvVar1->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar1->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar1,&local_28);
    local_2c = OMPC_bind;
    ppvVar3 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_2c);
    *ppvVar3 = pvVar1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot have two bind clause for the directive ")
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,directive->kind);
    std::operator<<(poVar2,", ignored\n");
    local_28 = (OpenMPClause *)0x0;
  }
  return local_28;
}

Assistant:

OpenMPClause* OpenMPBindClause::addBindClause(OpenMPDirective *directive, OpenMPBindClauseBinding bind_binding) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_bind);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPBindClause(bind_binding);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_bind] = current_clauses;
    } else { /* could be an error since if clause may only appear once */
        std::cerr << "Cannot have two bind clause for the directive " << directive->getKind() << ", ignored\n";
    };

    return new_clause;
}